

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Font.cpp
# Opt level: O2

Glyph * __thiscall
sf::Font::loadGlyph(Glyph *__return_storage_ptr__,Font *this,Uint32 codePoint,uint characterSize,
                   bool bold,float outlineThickness)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  pointer puVar1;
  FT_Glyph_Format FVar2;
  uint uVar3;
  uint uVar4;
  void *pvVar5;
  void *pvVar6;
  long lVar7;
  pointer puVar8;
  FT_Glyph pFVar9;
  bool bVar10;
  int iVar11;
  ostream *poVar12;
  long lVar13;
  size_type sVar14;
  uint width;
  ulong uVar15;
  Font *this_01;
  size_type __new_size;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  float fVar20;
  IntRect IVar21;
  FT_Glyph glyphDesc;
  uint characterSize_local;
  float local_78;
  mapped_type *local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  FT_Glyph local_38;
  
  (__return_storage_ptr__->textureRect).height = 0;
  *(undefined8 *)&(__return_storage_ptr__->bounds).height = 0;
  (__return_storage_ptr__->textureRect).top = 0;
  (__return_storage_ptr__->textureRect).width = 0;
  __return_storage_ptr__->advance = 0.0;
  (__return_storage_ptr__->bounds).left = 0.0;
  (__return_storage_ptr__->bounds).top = 0.0;
  (__return_storage_ptr__->bounds).width = 0.0;
  pvVar5 = this->m_face;
  if (pvVar5 != (void *)0x0) {
    characterSize_local = characterSize;
    local_78 = outlineThickness;
    bVar10 = setCurrentSize(this,characterSize);
    if (bVar10) {
      iVar11 = FT_Load_Char(pvVar5,codePoint,(-(local_78 != 0.0) & 1U) * '\b' + ' ');
      if (iVar11 == 0) {
        iVar11 = FT_Get_Glyph(*(undefined8 *)((long)pvVar5 + 0x98),&glyphDesc);
        if (iVar11 == 0) {
          FVar2 = glyphDesc->format;
          if (FVar2 == FT_GLYPH_FORMAT_OUTLINE) {
            if (bold) {
              FT_Outline_Embolden(glyphDesc + 1,0x40);
            }
            if ((local_78 != 0.0) || (NAN(local_78))) {
              pvVar6 = this->m_stroker;
              FT_Stroker_Set(pvVar6,(long)(local_78 * 64.0),1,0,0);
              FT_Glyph_Stroke(&glyphDesc,pvVar6,1);
            }
          }
          iVar11 = 1;
          FT_Glyph_To_Bitmap(&glyphDesc,0,0,1);
          pFVar9 = glyphDesc;
          if (FVar2 != FT_GLYPH_FORMAT_OUTLINE) {
            if (bold) {
              FT_Bitmap_Embolden(this->m_library,&glyphDesc[1].clazz,0x40);
            }
            if ((local_78 != 0.0) || (NAN(local_78))) {
              poVar12 = err();
              poVar12 = std::operator<<(poVar12,"Failed to outline glyph (no fallback available)");
              std::endl<char,std::char_traits<char>>(poVar12);
            }
          }
          fVar20 = (float)*(long *)(*(long *)((long)pvVar5 + 0x98) + 0x50) * 0.015625;
          if (bold) {
            fVar20 = fVar20 + 1.0;
          }
          __return_storage_ptr__->advance = fVar20;
          uVar3 = *(uint *)&pFVar9[1].clazz;
          uVar4 = *(uint *)((long)&pFVar9[1].clazz + 4);
          uVar18 = (ulong)uVar4;
          if (0 < (int)uVar3 && 0 < (int)uVar4) {
            this_01 = (Font *)&this->m_pages;
            local_38 = pFVar9;
            local_40 = (ulong)uVar3;
            local_68 = std::
                       map<unsigned_int,_sf::Font::Page,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_sf::Font::Page>_>_>
                       ::operator[]((map<unsigned_int,_sf::Font::Page,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_sf::Font::Page>_>_>
                                     *)this_01,&characterSize_local);
            width = (uint)(uVar18 + 2);
            IVar21 = findGlyphRect(this_01,local_68,width,uVar3 + 2);
            local_50 = IVar21._8_8_;
            local_48 = IVar21._0_8_;
            (__return_storage_ptr__->textureRect).left = IVar21.left + 1;
            local_58 = local_48 >> 0x20;
            (__return_storage_ptr__->textureRect).top = IVar21.top + 1;
            (__return_storage_ptr__->textureRect).width = IVar21.width + -2;
            local_60 = local_50 >> 0x20;
            (__return_storage_ptr__->textureRect).height = IVar21.height + -2;
            lVar13 = *(long *)((long)pvVar5 + 0x98);
            lVar7 = *(long *)(lVar13 + 0x48);
            (__return_storage_ptr__->bounds).left = (float)*(long *)(lVar13 + 0x40) * 0.015625;
            (__return_storage_ptr__->bounds).top = (float)lVar7 * -0.015625;
            lVar7 = *(long *)(lVar13 + 0x38);
            (__return_storage_ptr__->bounds).width =
                 local_78 + local_78 + (float)*(long *)(lVar13 + 0x30) * 0.015625;
            (__return_storage_ptr__->bounds).height = local_78 + local_78 + (float)lVar7 * 0.015625;
            this_00 = &this->m_pixelBuffer;
            __new_size = (size_type)(int)((uVar3 + 2) * width * 4);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this_00,__new_size);
            puVar8 = (this->m_pixelBuffer).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            for (sVar14 = 0; __new_size != sVar14; sVar14 = sVar14 + 4) {
              puVar1 = puVar8 + sVar14;
              puVar1[0] = 0xff;
              puVar1[1] = 0xff;
              puVar1[2] = 0xff;
              puVar1[3] = '\0';
            }
            lVar13 = local_38[1].advance.x;
            iVar19 = (int)local_40 + 1;
            if (*(char *)((long)&local_38[1].advance.y + 2) == '\x01') {
              iVar17 = uVar4 + 3;
              for (iVar11 = 1; iVar11 != iVar19; iVar11 = iVar11 + 1) {
                for (uVar16 = 0; uVar18 != uVar16; uVar16 = uVar16 + 1) {
                  (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start
                  [(ulong)(uint)((int)uVar16 + iVar17) * 4 + 3] =
                       -((*(byte *)(lVar13 + (uVar16 >> 3 & 0x1fffffff)) >> (~(byte)uVar16 & 7) & 1)
                        != 0);
                }
                lVar13 = lVar13 + (int)local_38[1].format;
                iVar17 = iVar17 + width;
              }
            }
            else {
              uVar16 = (ulong)(uVar4 + 3);
              for (; iVar11 != iVar19; iVar11 = iVar11 + 1) {
                for (uVar15 = 0; uVar18 != uVar15; uVar15 = uVar15 + 1) {
                  (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start
                  [(ulong)(uint)((int)uVar16 + (int)uVar15) * 4 + 3] = *(uchar *)(lVar13 + uVar15);
                }
                lVar13 = lVar13 + (int)local_38[1].format;
                uVar16 = uVar16 + uVar18 + 2;
              }
            }
            Texture::update(&local_68->texture,
                            (this_00->
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                            _M_impl.super__Vector_impl_data._M_start,(uint)local_50,(uint)local_60,
                            (uint)local_48,(uint)local_58);
          }
          FT_Done_Glyph(glyphDesc);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Glyph Font::loadGlyph(Uint32 codePoint, unsigned int characterSize, bool bold, float outlineThickness) const
{
    // The glyph to return
    Glyph glyph;

    // First, transform our ugly void* to a FT_Face
    FT_Face face = static_cast<FT_Face>(m_face);
    if (!face)
        return glyph;

    // Set the character size
    if (!setCurrentSize(characterSize))
        return glyph;

    // Load the glyph corresponding to the code point
    FT_Int32 flags = FT_LOAD_TARGET_NORMAL | FT_LOAD_FORCE_AUTOHINT;
    if (outlineThickness != 0)
        flags |= FT_LOAD_NO_BITMAP;
    if (FT_Load_Char(face, codePoint, flags) != 0)
        return glyph;

    // Retrieve the glyph
    FT_Glyph glyphDesc;
    if (FT_Get_Glyph(face->glyph, &glyphDesc) != 0)
        return glyph;

    // Apply bold and outline (there is no fallback for outline) if necessary -- first technique using outline (highest quality)
    FT_Pos weight = 1 << 6;
    bool outline = (glyphDesc->format == FT_GLYPH_FORMAT_OUTLINE);
    if (outline)
    {
        if (bold)
        {
            FT_OutlineGlyph outlineGlyph = (FT_OutlineGlyph)glyphDesc;
            FT_Outline_Embolden(&outlineGlyph->outline, weight);
        }

        if (outlineThickness != 0)
        {
            FT_Stroker stroker = static_cast<FT_Stroker>(m_stroker);

            FT_Stroker_Set(stroker, static_cast<FT_Fixed>(outlineThickness * static_cast<float>(1 << 6)), FT_STROKER_LINECAP_ROUND, FT_STROKER_LINEJOIN_ROUND, 0);
            FT_Glyph_Stroke(&glyphDesc, stroker, true);
        }
    }

    // Convert the glyph to a bitmap (i.e. rasterize it)
    FT_Glyph_To_Bitmap(&glyphDesc, FT_RENDER_MODE_NORMAL, 0, 1);
    FT_Bitmap& bitmap = reinterpret_cast<FT_BitmapGlyph>(glyphDesc)->bitmap;

    // Apply bold if necessary -- fallback technique using bitmap (lower quality)
    if (!outline)
    {
        if (bold)
            FT_Bitmap_Embolden(static_cast<FT_Library>(m_library), &bitmap, weight, weight);

        if (outlineThickness != 0)
            err() << "Failed to outline glyph (no fallback available)" << std::endl;
    }

    // Compute the glyph's advance offset
    glyph.advance = static_cast<float>(face->glyph->metrics.horiAdvance) / static_cast<float>(1 << 6);
    if (bold)
        glyph.advance += static_cast<float>(weight) / static_cast<float>(1 << 6);

    int width  = bitmap.width;
    int height = bitmap.rows;

    if ((width > 0) && (height > 0))
    {
        // Leave a small padding around characters, so that filtering doesn't
        // pollute them with pixels from neighbors
        const unsigned int padding = 1;

        width += 2 * padding;
        height += 2 * padding;

        // Get the glyphs page corresponding to the character size
        Page& page = m_pages[characterSize];

        // Find a good position for the new glyph into the texture
        glyph.textureRect = findGlyphRect(page, width, height);

        // Make sure the texture data is positioned in the center
        // of the allocated texture rectangle
        glyph.textureRect.left += padding;
        glyph.textureRect.top += padding;
        glyph.textureRect.width -= 2 * padding;
        glyph.textureRect.height -= 2 * padding;

        // Compute the glyph's bounding box
        glyph.bounds.left   =  static_cast<float>(face->glyph->metrics.horiBearingX) / static_cast<float>(1 << 6);
        glyph.bounds.top    = -static_cast<float>(face->glyph->metrics.horiBearingY) / static_cast<float>(1 << 6);
        glyph.bounds.width  =  static_cast<float>(face->glyph->metrics.width)        / static_cast<float>(1 << 6) + outlineThickness * 2;
        glyph.bounds.height =  static_cast<float>(face->glyph->metrics.height)       / static_cast<float>(1 << 6) + outlineThickness * 2;

        // Resize the pixel buffer to the new size and fill it with transparent white pixels
        m_pixelBuffer.resize(width * height * 4);

        Uint8* current = &m_pixelBuffer[0];
        Uint8* end = current + width * height * 4;

        while (current != end)
        {
            (*current++) = 255;
            (*current++) = 255;
            (*current++) = 255;
            (*current++) = 0;
        }

        // Extract the glyph's pixels from the bitmap
        const Uint8* pixels = bitmap.buffer;
        if (bitmap.pixel_mode == FT_PIXEL_MODE_MONO)
        {
            // Pixels are 1 bit monochrome values
            for (unsigned int y = padding; y < height - padding; ++y)
            {
                for (unsigned int x = padding; x < width - padding; ++x)
                {
                    // The color channels remain white, just fill the alpha channel
                    std::size_t index = x + y * width;
                    m_pixelBuffer[index * 4 + 3] = ((pixels[(x - padding) / 8]) & (1 << (7 - ((x - padding) % 8)))) ? 255 : 0;
                }
                pixels += bitmap.pitch;
            }
        }
        else
        {
            // Pixels are 8 bits gray levels
            for (unsigned int y = padding; y < height - padding; ++y)
            {
                for (unsigned int x = padding; x < width - padding; ++x)
                {
                    // The color channels remain white, just fill the alpha channel
                    std::size_t index = x + y * width;
                    m_pixelBuffer[index * 4 + 3] = pixels[x - padding];
                }
                pixels += bitmap.pitch;
            }
        }

        // Write the pixels to the texture
        unsigned int x = glyph.textureRect.left - padding;
        unsigned int y = glyph.textureRect.top - padding;
        unsigned int w = glyph.textureRect.width + 2 * padding;
        unsigned int h = glyph.textureRect.height + 2 * padding;
        page.texture.update(&m_pixelBuffer[0], w, h, x, y);
    }

    // Delete the FT glyph
    FT_Done_Glyph(glyphDesc);

    // Done :)
    return glyph;
}